

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int argc_local;
  tst_future tc;
  QCoreApplication app;
  
  argc_local = argc;
  QCoreApplication::QCoreApplication(&app,&argc_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_future::tst_future(&tc);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O2/tests/auto/qtpromise/future"
            );
  iVar1 = QTest::qExec(&tc.super_QObject,argc_local,argv);
  QObject::~QObject(&tc.super_QObject);
  QCoreApplication::~QCoreApplication(&app);
  return iVar1;
}

Assistant:

void tst_future::fulfilled()
{
    int result = -1;
    auto p = QtPromise::resolve(QtConcurrent::run([]() {
        return 42;
    }));

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(p.isPending(), true);

    p.then([&](int res) {
         result = res;
     }).wait();

    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(result, 42);
}